

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O3

void __thiscall
BamTools::ConvertPileupFormatVisitor::Visit
          (ConvertPileupFormatVisitor *this,PileupPosition *pileupData)

{
  int *position;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pPVar2;
  bool bVar3;
  byte bVar4;
  undefined1 uVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  char cVar9;
  long lVar10;
  int iVar11;
  pointer pPVar12;
  char referenceBase;
  char deletedBase;
  string TAB;
  stringstream bases;
  stringstream mapQualities;
  stringstream baseQualities;
  char local_6c9;
  int local_6c8;
  undefined4 uStack_6c4;
  long local_6c0;
  undefined1 local_6b8 [20];
  int local_6a4;
  pointer local_6a0;
  pointer local_698;
  int *local_690;
  pointer local_688;
  Fasta *local_680;
  char local_678;
  undefined7 uStack_677;
  long local_670;
  undefined1 local_668 [16];
  char *local_658;
  long local_650;
  char local_648 [16];
  BamAlignment local_638;
  int32_t local_4e0;
  undefined4 uStack_4dc;
  int iStack_4d8;
  int iStack_4d4;
  undefined2 local_4d0;
  stringstream local_4c8 [16];
  ostream local_4b8 [112];
  ios_base aiStack_448 [264];
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base aiStack_138 [264];
  
  local_6a0 = (pileupData->PileupAlignments).
              super__Vector_base<BamTools::PileupAlignment,_std::allocator<BamTools::PileupAlignment>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_698 = (pileupData->PileupAlignments).
              super__Vector_base<BamTools::PileupAlignment,_std::allocator<BamTools::PileupAlignment>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_6a0 != local_698) {
    position = &pileupData->Position;
    local_688 = (this->m_references).
                super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
                super__Vector_impl_data._M_start + pileupData->RefId;
    local_6c9 = 'N';
    if ((this->m_hasFasta == true) && (*position < local_688->RefLength)) {
      bVar3 = Fasta::GetBase(&this->m_fasta,&pileupData->RefId,position,&local_6c9);
      if (!bVar3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "bamtools convert ERROR: pileup conversion - could not read reference base from FASTA file"
                   ,0x59);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
        std::ostream::put('(');
        std::ostream::flush();
        return;
      }
      local_6a0 = (pileupData->PileupAlignments).
                  super__Vector_base<BamTools::PileupAlignment,_std::allocator<BamTools::PileupAlignment>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      local_698 = (pileupData->PileupAlignments).
                  super__Vector_base<BamTools::PileupAlignment,_std::allocator<BamTools::PileupAlignment>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    }
    local_690 = position;
    std::__cxx11::stringstream::stringstream(local_4c8);
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__cxx11::stringstream::stringstream(local_340);
    pPVar12 = (pileupData->PileupAlignments).
              super__Vector_base<BamTools::PileupAlignment,_std::allocator<BamTools::PileupAlignment>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pPVar2 = (pileupData->PileupAlignments).
             super__Vector_base<BamTools::PileupAlignment,_std::allocator<BamTools::PileupAlignment>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pPVar12 != pPVar2) {
      local_680 = &this->m_fasta;
      do {
        BamAlignment::BamAlignment(&local_638,&pPVar12->Alignment);
        local_4d0._0_1_ = pPVar12->IsSegmentBegin;
        local_4d0._1_1_ = pPVar12->IsSegmentEnd;
        local_4e0 = pPVar12->PositionInAlignment;
        uStack_4dc._0_1_ = pPVar12->IsCurrentDeletion;
        uStack_4dc._1_1_ = pPVar12->IsNextDeletion;
        uStack_4dc._2_1_ = pPVar12->IsNextInsertion;
        uStack_4dc._3_1_ = pPVar12->field_0x15f;
        iStack_4d8 = pPVar12->DeletionLength;
        iStack_4d4 = pPVar12->InsertionLength;
        if ((undefined1)local_4d0 == '\x01') {
          local_6c8._0_1_ = 0x5e;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_4b8,(char *)&local_6c8,1);
          cVar9 = (char)local_638.MapQuality + '!';
          if (0x5d < local_638.MapQuality) {
            cVar9 = '~';
          }
          local_6c8 = CONCAT31(local_6c8._1_3_,cVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_6c8,1);
        }
        if ((char)uStack_4dc == '\0') {
          if (local_638.QueryBases._M_string_length <= (ulong)(long)local_4e0) {
            std::__throw_out_of_range_fmt
                      ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
          }
          iVar11 = (int)local_638.QueryBases._M_dataplus._M_p[local_4e0];
          if (iVar11 == 0x3d) {
LAB_00114612:
            bVar3 = BamAlignment::IsReverseStrand(&local_638);
            bVar4 = !bVar3 * '\x02' | 0x2c;
          }
          else {
            iVar6 = toupper(iVar11);
            local_6a4 = (int)local_6c9;
            iVar7 = toupper(local_6a4);
            if (iVar6 == iVar7) goto LAB_00114612;
            iVar6 = tolower(iVar11);
            iVar7 = tolower(local_6a4);
            if (iVar6 == iVar7) goto LAB_00114612;
            bVar3 = BamAlignment::IsReverseStrand(&local_638);
            if (bVar3) {
              iVar11 = tolower(iVar11);
              bVar4 = (byte)iVar11;
            }
            else {
              iVar11 = toupper(iVar11);
              bVar4 = (byte)iVar11;
            }
          }
          local_6c8 = CONCAT31(local_6c8._1_3_,bVar4);
          std::__ostream_insert<char,std::char_traits<char>>(local_4b8,(char *)&local_6c8,1);
          if (uStack_4dc._2_1_ == '\x01') {
            local_6c8 = CONCAT31(local_6c8._1_3_,0x2b);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_4b8,(char *)&local_6c8,1);
            std::ostream::operator<<(poVar8,iStack_4d4);
            if (0 < iStack_4d4) {
              lVar10 = 1;
              do {
                if (local_638.QueryBases._M_string_length <= (ulong)(lVar10 + local_4e0)) {
                  std::__throw_out_of_range_fmt
                            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
                }
                cVar9 = local_638.QueryBases._M_dataplus._M_p[lVar10 + local_4e0];
                bVar3 = BamAlignment::IsReverseStrand(&local_638);
                if (bVar3) {
                  iVar11 = tolower((int)cVar9);
                  uVar5 = (undefined1)iVar11;
                }
                else {
                  iVar11 = toupper((int)cVar9);
                  uVar5 = (undefined1)iVar11;
                }
                local_6c8 = CONCAT31(local_6c8._1_3_,uVar5);
                std::__ostream_insert<char,std::char_traits<char>>(local_4b8,(char *)&local_6c8,1);
                iVar11 = (int)lVar10;
                lVar10 = lVar10 + 1;
              } while (iVar11 < iStack_4d4);
            }
          }
          else if (uStack_4dc._1_1_ == '\x01') {
            local_6c8 = CONCAT31(local_6c8._1_3_,0x2d);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_4b8,(char *)&local_6c8,1);
            std::ostream::operator<<(poVar8,iStack_4d8);
            if (0 < iStack_4d8) {
              iVar11 = 0;
              do {
                local_678 = 'N';
                if (((this->m_hasFasta == true) &&
                    (iVar6 = pileupData->Position + iVar11 + 1,
                    iVar6 < (this->m_references).
                            super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>
                            ._M_impl.super__Vector_impl_data._M_start[pileupData->RefId].RefLength))
                   && (local_6c8 = iVar6,
                      bVar3 = Fasta::GetBase(local_680,&pileupData->RefId,&local_6c8,&local_678),
                      !bVar3)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,
                             "bamtools convert ERROR: pileup conversion - could not read reference base from FASTA file"
                             ,0x59);
                  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
                  std::ostream::put('(');
                  std::ostream::flush();
                  BamAlignment::~BamAlignment(&local_638);
                  goto LAB_00114b18;
                }
                bVar3 = BamAlignment::IsReverseStrand(&local_638);
                if (bVar3) {
                  iVar6 = tolower((int)local_678);
                  uVar5 = (undefined1)iVar6;
                }
                else {
                  iVar6 = toupper((int)local_678);
                  uVar5 = (undefined1)iVar6;
                }
                local_6c8 = CONCAT31(local_6c8._1_3_,uVar5);
                std::__ostream_insert<char,std::char_traits<char>>(local_4b8,(char *)&local_6c8,1);
                iVar11 = iVar11 + 1;
              } while (iVar11 < iStack_4d8);
            }
          }
        }
        else {
          local_6c8 = CONCAT31(local_6c8._1_3_,0x2a);
          std::__ostream_insert<char,std::char_traits<char>>(local_4b8,(char *)&local_6c8,1);
        }
        if (local_4d0._1_1_ == '\x01') {
          local_6c8 = CONCAT31(local_6c8._1_3_,0x24);
          std::__ostream_insert<char,std::char_traits<char>>(local_4b8,(char *)&local_6c8,1);
        }
        if (local_638.Qualities._M_string_length <= (ulong)(long)local_4e0) {
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
        }
        local_6c8 = CONCAT31(local_6c8._1_3_,local_638.Qualities._M_dataplus._M_p[local_4e0]);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_6c8,1);
        if (this->m_isPrintingMapQualities == true) {
          cVar9 = (char)local_638.MapQuality + '!';
          if (0x5d < local_638.MapQuality) {
            cVar9 = '~';
          }
          local_6c8 = CONCAT31(local_6c8._1_3_,cVar9);
          std::__ostream_insert<char,std::char_traits<char>>(local_330,(char *)&local_6c8,1);
        }
        BamAlignment::~BamAlignment(&local_638);
        pPVar12 = pPVar12 + 1;
      } while (pPVar12 != pPVar2);
    }
    paVar1 = &local_638.Name.field_2;
    local_638.Name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_638,'\x01');
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (this->m_out,(local_688->RefName)._M_dataplus._M_p,
                        (local_688->RefName)._M_string_length);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_638.Name._M_dataplus._M_p,local_638.Name._M_string_length);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,*local_690 + 1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_638.Name._M_dataplus._M_p,local_638.Name._M_string_length);
    local_6c8 = CONCAT31(local_6c8._1_3_,local_6c9);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_6c8,1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_638.Name._M_dataplus._M_p,local_638.Name._M_string_length);
    poVar8 = (ostream *)
             std::ostream::operator<<
                       (poVar8,(int)((ulong)((long)local_698 - (long)local_6a0) >> 4) * -0x1642c859)
    ;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_638.Name._M_dataplus._M_p,local_638.Name._M_string_length);
    std::__cxx11::stringbuf::str();
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(char *)CONCAT44(uStack_6c4,local_6c8),local_6c0);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_638.Name._M_dataplus._M_p,local_638.Name._M_string_length);
    std::__cxx11::stringbuf::str();
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(char *)CONCAT71(uStack_677,local_678),local_670);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_638.Name._M_dataplus._M_p,local_638.Name._M_string_length);
    std::__cxx11::stringbuf::str();
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_658,local_650);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    if (local_658 != local_648) {
      operator_delete(local_658);
    }
    if ((undefined1 *)CONCAT71(uStack_677,local_678) != local_668) {
      operator_delete((undefined1 *)CONCAT71(uStack_677,local_678));
    }
    if ((undefined1 *)CONCAT44(uStack_6c4,local_6c8) != local_6b8) {
      operator_delete((undefined1 *)CONCAT44(uStack_6c4,local_6c8));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_638.Name._M_dataplus._M_p != paVar1) {
      operator_delete(local_638.Name._M_dataplus._M_p);
    }
LAB_00114b18:
    std::__cxx11::stringstream::~stringstream(local_340);
    std::ios_base::~ios_base(aiStack_2c0);
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(aiStack_138);
    std::__cxx11::stringstream::~stringstream(local_4c8);
    std::ios_base::~ios_base(aiStack_448);
  }
  return;
}

Assistant:

void ConvertPileupFormatVisitor::Visit(const PileupPosition& pileupData)
{

    // skip if no alignments at this position
    if (pileupData.PileupAlignments.empty()) {
        return;
    }

    // retrieve reference name
    const std::string& referenceName = m_references[pileupData.RefId].RefName;
    const int& position = pileupData.Position;

    // retrieve reference base from FASTA file, if one provided; otherwise default to 'N'
    char referenceBase('N');
    if (m_hasFasta && (pileupData.Position < m_references[pileupData.RefId].RefLength)) {
        if (!m_fasta.GetBase(pileupData.RefId, pileupData.Position, referenceBase)) {
            std::cerr << "bamtools convert ERROR: pileup conversion - could not read reference "
                         "base from FASTA file"
                      << std::endl;
            return;
        }
    }

    // get count of alleles at this position
    const int numberAlleles = pileupData.PileupAlignments.size();

    // -----------------------------------------------------------
    // build strings based on alleles at this positionInAlignment

    std::stringstream bases;
    std::stringstream baseQualities;
    std::stringstream mapQualities;

    // iterate over alignments at this pileup position
    std::vector<PileupAlignment>::const_iterator pileupIter = pileupData.PileupAlignments.begin();
    std::vector<PileupAlignment>::const_iterator pileupEnd = pileupData.PileupAlignments.end();
    for (; pileupIter != pileupEnd; ++pileupIter) {
        const PileupAlignment pa = (*pileupIter);
        const BamAlignment& ba = pa.Alignment;

        // if beginning of read segment
        if (pa.IsSegmentBegin) {
            bases << '^'
                  << (((int)ba.MapQuality > 93) ? (char)126 : (char)((int)ba.MapQuality + 33));
        }

        // if current base is not a DELETION
        if (!pa.IsCurrentDeletion) {

            // get base at current position
            char base = ba.QueryBases.at(pa.PositionInAlignment);

            // if base matches reference
            if (base == '=' || std::toupper(base) == std::toupper(referenceBase) ||
                std::tolower(base) == std::tolower(referenceBase)) {
                base = (ba.IsReverseStrand() ? ',' : '.');
            }

            // mismatches reference
            else {
                base = (ba.IsReverseStrand() ? std::tolower(base) : std::toupper(base));
            }

            // store base
            bases << base;

            // if next position contains insertion
            if (pa.IsNextInsertion) {
                bases << '+' << pa.InsertionLength;
                for (int i = 1; i <= pa.InsertionLength; ++i) {
                    char insertedBase = (char)ba.QueryBases.at(pa.PositionInAlignment + i);
                    bases << (ba.IsReverseStrand() ? (char)std::tolower(insertedBase)
                                                   : (char)std::toupper(insertedBase));
                }
            }

            // if next position contains DELETION
            else if (pa.IsNextDeletion) {
                bases << '-' << pa.DeletionLength;
                for (int i = 1; i <= pa.DeletionLength; ++i) {
                    char deletedBase('N');
                    if (m_hasFasta &&
                        (pileupData.Position + i < m_references[pileupData.RefId].RefLength)) {
                        if (!m_fasta.GetBase(pileupData.RefId, pileupData.Position + i,
                                             deletedBase)) {
                            std::cerr << "bamtools convert ERROR: pileup conversion - could not "
                                         "read reference base from FASTA file"
                                      << std::endl;
                            return;
                        }
                    }
                    bases << (ba.IsReverseStrand() ? (char)std::tolower(deletedBase)
                                                   : (char)std::toupper(deletedBase));
                }
            }
        }

        // otherwise, DELETION
        else {
            bases << '*';
        }

        // if end of read segment
        if (pa.IsSegmentEnd) {
            bases << '$';
        }

        // store current base quality
        baseQualities << ba.Qualities.at(pa.PositionInAlignment);

        // save alignment map quality if desired
        if (m_isPrintingMapQualities) {
            mapQualities << (((int)ba.MapQuality > 93) ? (char)126
                                                       : (char)((int)ba.MapQuality + 33));
        }
    }

    // ----------------------
    // print results

    // tab-delimited
    // <refName> <1-based pos> <refBase> <numberAlleles> <bases> <qualities> [mapQuals]

    const std::string TAB(1, '\t');
    *m_out << referenceName << TAB << position + 1 << TAB << referenceBase << TAB << numberAlleles
           << TAB << bases.str() << TAB << baseQualities.str() << TAB << mapQualities.str()
           << std::endl;
}